

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawLineStrip(Vector2 *points,int pointCount,Color color)

{
  ulong uVar1;
  
  if (pointCount < 2) {
    return;
  }
  rlBegin(1);
  rlColor4ub(color.r,color.g,color.b,color.a);
  for (uVar1 = 0; pointCount - 1 != uVar1; uVar1 = uVar1 + 1) {
    rlVertex2f(points[uVar1].x,points[uVar1].y);
    rlVertex2f(points[uVar1 + 1].x,points[uVar1 + 1].y);
  }
  rlEnd();
  return;
}

Assistant:

void DrawLineStrip(const Vector2 *points, int pointCount, Color color)
{
    if (pointCount < 2) return; // Security check

    rlBegin(RL_LINES);
        rlColor4ub(color.r, color.g, color.b, color.a);

        for (int i = 0; i < pointCount - 1; i++)
        {
            rlVertex2f(points[i].x, points[i].y);
            rlVertex2f(points[i + 1].x, points[i + 1].y);
        }
    rlEnd();
}